

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float __thiscall ImGuiStorage::GetFloat(ImGuiStorage *this,ImGuiID key,float default_val)

{
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pIVar2 = (this->Data).Data;
  uVar4 = (ulong)(this->Data).Size;
  pIVar1 = pIVar2;
  uVar5 = uVar4;
  while (uVar3 = uVar5, uVar3 != 0) {
    uVar5 = uVar3 >> 1;
    if (pIVar1[uVar5].key < key) {
      pIVar1 = pIVar1 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar3;
    }
  }
  if ((pIVar1 != pIVar2 + uVar4) && (pIVar1->key == key)) {
    default_val = (pIVar1->field_1).val_f;
  }
  return default_val;
}

Assistant:

static ImGuiStorage::ImGuiStoragePair* LowerBound(ImVector<ImGuiStorage::ImGuiStoragePair>& data, ImGuiID key)
{
    ImGuiStorage::ImGuiStoragePair* first = data.Data;
    ImGuiStorage::ImGuiStoragePair* last = data.Data + data.Size;
    size_t count = (size_t)(last - first);
    while (count > 0)
    {
        size_t count2 = count >> 1;
        ImGuiStorage::ImGuiStoragePair* mid = first + count2;
        if (mid->key < key)
        {
            first = ++mid;
            count -= count2 + 1;
        }
        else
        {
            count = count2;
        }
    }
    return first;
}